

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exp.h
# Opt level: O0

RegEx * YAML::Exp::Hex(void)

{
  int iVar1;
  RegEx *pRVar2;
  undefined2 uVar3;
  RegEx *in_stack_ffffffffffffff90;
  RegEx *in_stack_ffffffffffffffb0;
  RegEx *in_stack_ffffffffffffffb8;
  
  if (Hex()::e == '\0') {
    iVar1 = __cxa_guard_acquire(&Hex()::e);
    if (iVar1 != 0) {
      pRVar2 = Digit();
      uVar3 = (undefined2)((ulong)pRVar2 >> 0x30);
      RegEx::RegEx(in_stack_ffffffffffffff90,(char)((ulong)pRVar2 >> 0x38),
                   (char)((ulong)pRVar2 >> 0x30));
      operator|(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
      RegEx::RegEx(in_stack_ffffffffffffff90,(char)((ushort)uVar3 >> 8),(char)uVar3);
      operator|(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
      RegEx::~RegEx((RegEx *)0xf03c87);
      RegEx::~RegEx((RegEx *)0xf03c91);
      RegEx::~RegEx((RegEx *)0xf03c9b);
      __cxa_atexit(RegEx::~RegEx,&Hex::e,&__dso_handle);
      __cxa_guard_release(&Hex()::e);
    }
  }
  return &Hex::e;
}

Assistant:

inline const RegEx& Hex() {
  static const RegEx e = Digit() | RegEx('A', 'F') | RegEx('a', 'f');
  return e;
}